

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

double __thiscall chrono::fea::ChElementShellANCF_3833::GetDensity(ChElementShellANCF_3833 *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  pointer pLVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  iVar4 = this->m_numLayers;
  if (iVar4 < 1) {
    dVar8 = 0.0;
  }
  else {
    pLVar5 = (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar9 = ZEXT816(0);
    lVar7 = 0;
    lVar6 = 0;
    do {
      puVar3 = *(ulong **)
                ((long)&(pLVar5->m_material).
                        super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + lVar7);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(pLVar5->m_material).
                         super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount + lVar7);
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        uVar1 = *puVar3;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        uVar1 = *puVar3;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        auVar9._8_8_ = 0;
        pLVar5 = (this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar4 = this->m_numLayers;
      }
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)&pLVar5->m_thickness + lVar7);
      auVar9 = vfmadd231sd_fma(auVar9,auVar10,auVar2);
      dVar8 = auVar9._0_8_;
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x20;
    } while (lVar6 < iVar4);
  }
  return dVar8 / this->m_thicknessZ;
}

Assistant:

double ChElementShellANCF_3833::GetDensity() {
    double tot_density = 0;
    for (int kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / m_thicknessZ;
}